

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglMultiThreadTests.cpp
# Opt level: O0

void __thiscall deqp::egl::MultiThreadedTest::barrier(MultiThreadedTest *this,TestThread *thread)

{
  deInt32 dVar1;
  ThreadStatus TVar2;
  undefined8 uVar3;
  deInt32 waiters_1;
  deInt32 waiters;
  TestThread *thread_local;
  MultiThreadedTest *this_local;
  
  dVar1 = deAtomicIncrementInt32(&this->m_barrierWaiters);
  if (dVar1 == this->m_threadCount) {
    de::Semaphore::decrement(&this->m_barrierSemaphore2);
    de::Semaphore::increment(&this->m_barrierSemaphore1);
  }
  else {
    de::Semaphore::decrement(&this->m_barrierSemaphore1);
    de::Semaphore::increment(&this->m_barrierSemaphore1);
  }
  dVar1 = deAtomicDecrementInt32(&this->m_barrierWaiters);
  if (dVar1 == 0) {
    de::Semaphore::decrement(&this->m_barrierSemaphore1);
    de::Semaphore::increment(&this->m_barrierSemaphore2);
  }
  else {
    de::Semaphore::decrement(&this->m_barrierSemaphore2);
    de::Semaphore::increment(&this->m_barrierSemaphore2);
  }
  TVar2 = TestThread::getStatus(thread);
  if (TVar2 != THREADSTATUS_RUNNING) {
    uVar3 = __cxa_allocate_exception(1);
    __cxa_throw(uVar3,&TestThread::TestStop::typeinfo,0);
  }
  return;
}

Assistant:

void MultiThreadedTest::barrier (TestThread& thread)
{
	{
		const deInt32 waiters = deAtomicIncrement32(&m_barrierWaiters);

		if (waiters == m_threadCount)
		{
			m_barrierSemaphore2.decrement();
			m_barrierSemaphore1.increment();
		}
		else
		{
			m_barrierSemaphore1.decrement();
			m_barrierSemaphore1.increment();
		}
	}

	{
		const deInt32 waiters = deAtomicDecrement32(&m_barrierWaiters);

		if (waiters == 0)
		{
			m_barrierSemaphore1.decrement();
			m_barrierSemaphore2.increment();
		}
		else
		{
			m_barrierSemaphore2.decrement();
			m_barrierSemaphore2.increment();
		}
	}

	// Barrier was released due an error in other thread
	if (thread.getStatus() != TestThread::THREADSTATUS_RUNNING)
		throw TestThread::TestStop();
}